

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

char * str_substring(char *str,size_t startidx,long endidx)

{
  size_t sVar1;
  char *__dest;
  char *b;
  size_t blen;
  long endidx_local;
  size_t startidx_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    __assert_fail("str != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x26f,"char *str_substring(const char *, size_t, long)");
  }
  sVar1 = strlen(str);
  if (sVar1 + 1 < startidx) {
    __assert_fail("startidx >= 0 && startidx <= strlen(str)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x270,"char *str_substring(const char *, size_t, long)");
  }
  if ((-1 < endidx) && ((ulong)endidx < startidx)) {
    __assert_fail("endidx < 0 || endidx >= startidx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x271,"char *str_substring(const char *, size_t, long)");
  }
  if ((-1 < endidx) && (sVar1 = strlen(str), sVar1 + 1 < (ulong)endidx)) {
    __assert_fail("endidx < 0 || endidx <= strlen(str)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x272,"char *str_substring(const char *, size_t, long)");
  }
  blen = endidx;
  if (endidx < 0) {
    blen = strlen(str);
  }
  sVar1 = blen - startidx;
  __dest = (char *)malloc(sVar1 + 1);
  memcpy(__dest,str + startidx,sVar1);
  __dest[sVar1] = '\0';
  return __dest;
}

Assistant:

char *str_substring(const char *str, size_t startidx, long endidx)
{
    assert(str != NULL);
    assert(startidx >= 0 && startidx <= strlen(str)+1);
    assert(endidx < 0 || endidx >= startidx);
    assert(endidx < 0 || endidx <= strlen(str)+1);

    if (endidx < 0)
        endidx = (long) strlen(str);

    size_t blen = endidx - startidx; // not counting \0
    char *b = malloc(blen + 1);
    memcpy(b, &str[startidx], blen);
    b[blen] = 0;
    return b;
}